

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb2mllr_io.c
# Opt level: O0

int s3map_read(char *fn,void **out_map,uint32 *out_n_dom,uint32 *out_n_rng,size_t map_elem_size)

{
  int32 iVar1;
  int iVar2;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar3;
  int local_7c;
  char **ppcStack_78;
  int i;
  char **argval;
  char **argname;
  FILE *pFStack_60;
  int32 swap;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 local_40;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 rd_chksum;
  size_t map_elem_size_local;
  uint32 *out_n_rng_local;
  uint32 *out_n_dom_local;
  void **out_map_local;
  char *fn_local;
  
  ignore = 0;
  _sv_chksum = map_elem_size;
  map_elem_size_local = (size_t)out_n_rng;
  out_n_rng_local = out_n_dom;
  out_n_dom_local = (uint32 *)out_map;
  out_map_local = (void **)fn;
  pFStack_60 = fopen(fn,"rb");
  if (pFStack_60 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cb2mllr_io.c"
                   ,0x4d,"fopen(%s,rb) failed\n",out_map_local);
    exit(1);
  }
  iVar1 = bio_readhdr((FILE *)pFStack_60,&argval,&stack0xffffffffffffff88,
                      (int32 *)((long)&argname + 4));
  if (iVar1 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cb2mllr_io.c"
            ,0x51,"bio_readhdr(%s) failed\n",out_map_local);
    exit(1);
  }
  fp = (FILE *)0x0;
  do_chk = (char *)0x0;
  for (local_7c = 0; uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20),
      argval[local_7c] != (char *)0x0; local_7c = local_7c + 1) {
    iVar2 = strcmp(argval[local_7c],"version");
    if (iVar2 == 0) {
      iVar2 = strcmp(ppcStack_78[local_7c],"1.2");
      if (iVar2 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cb2mllr_io.c"
                ,0x59,"Version mismatch(%s): %s, expecting %s\n",out_map_local,ppcStack_78[local_7c]
                ,"1.2");
        exit(1);
      }
      do_chk = ppcStack_78[local_7c];
    }
    else {
      iVar2 = strcmp(argval[local_7c],"chksum0");
      if (iVar2 == 0) {
        fp = (FILE *)ppcStack_78[local_7c];
      }
    }
  }
  if (do_chk != (char *)0x0) {
    bio_hdrarg_free(argval,ppcStack_78);
    ppcStack_78 = (char **)0x0;
    argval = (char **)0x0;
    iVar1 = bio_fread((void *)map_elem_size_local,4,1,(FILE *)pFStack_60,argname._4_4_,&ignore);
    if (iVar1 == 1) {
      iVar1 = bio_fread_1d((void **)out_n_dom_local,_sv_chksum,out_n_rng_local,(FILE *)pFStack_60,
                           argname._4_4_,&ignore);
      if (iVar1 < 0) {
        fclose(pFStack_60);
        fn_local._4_4_ = -1;
      }
      else {
        if (fp != (FILE *)0x0) {
          iVar1 = bio_fread(&local_40,4,1,(FILE *)pFStack_60,argname._4_4_,
                            (uint32 *)((long)&ver + 4));
          if (iVar1 != 1) {
            fclose(pFStack_60);
            return -1;
          }
          if (local_40 != ignore) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cb2mllr_io.c"
                    ,0x7c,"Checksum error; read corrupted data.\n");
            exit(1);
          }
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cb2mllr_io.c"
                ,0x80,"Read %s [%u mappings to %u]\n",out_map_local,(ulong)*out_n_rng_local,
                CONCAT44(uVar3,*(undefined4 *)map_elem_size_local));
        fn_local._4_4_ = 0;
      }
    }
    else {
      fclose(pFStack_60);
      fn_local._4_4_ = -1;
    }
    return fn_local._4_4_;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cb2mllr_io.c"
          ,0x62,"No version attribute for %s\n",out_map_local);
  exit(1);
}

Assistant:

static int
s3map_read(const char *fn, /**< The file name */
           void **out_map,
           uint32 * out_n_dom, uint32 * out_n_rng, size_t map_elem_size)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    int32 swap;
    char **argname, **argval;
    int i;

    if ((fp = fopen(fn, "rb")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,rb) failed\n", fn);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &swap) < 0)
        E_FATAL("bio_readhdr(%s) failed\n", fn);

    /* Parse argument-value list */
    ver = do_chk = NULL;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MAP_FILE_VERSION) != 0) {
                E_FATAL("Version mismatch(%s): %s, expecting %s\n",
                        fn, argval[i], MAP_FILE_VERSION);
            }
            ver = argval[i];
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            do_chk = argval[i];
        }
    }
    if (ver == NULL)
        E_FATAL("No version attribute for %s\n", fn);
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    if (bio_fread(out_n_rng, sizeof(uint32), 1, fp, swap, &rd_chksum) != 1) {
        fclose(fp);

        return S3_ERROR;
    }

    if (bio_fread_1d(out_map,
                     map_elem_size, out_n_dom, fp, swap, &rd_chksum) < 0) {
        fclose(fp);

        return S3_ERROR;
    }

    if (do_chk) {
        if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) !=
            1) {
            fclose(fp);

            return S3_ERROR;
        }

        if (sv_chksum != rd_chksum) {
            E_FATAL("Checksum error; read corrupted data.\n");
        }
    }

    E_INFO("Read %s [%u mappings to %u]\n", fn, *out_n_dom, *out_n_rng);

    return S3_SUCCESS;
}